

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GroupCase::iterate(GroupCase *this)

{
  MessageData *message;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  GLenum severity;
  CallLogWrapper wrapper;
  CallLogWrapper local_30;
  Functions *gl;
  
  bVar1 = isKHRDebugSupported((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  if (bVar1) {
    iVar2 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    gl = (Functions *)CONCAT44(extraout_var,iVar2);
    glu::CallLogWrapper::CallLogWrapper
              (&local_30,gl,
               ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log);
    (*gl->enable)(0x92e0);
    (*gl->enable)(0x8242);
    (*gl->debugMessageControl)(0x1100,0x1100,0x1100,0,(GLuint *)0x0,'\0');
    (*gl->debugMessageControl)(0x8246,0x824c,0x1100,0,(GLuint *)0x0,'\x01');
    (*gl->debugMessageControl)(0x824a,0x1100,0x1100,0,(GLuint *)0x0,'\x01');
    severity = 1;
    (*gl->debugMessageControl)(0x8249,0x1100,0x1100,0,(GLuint *)0x0,'\x01');
    (*gl->debugMessageCallback)(BaseCase::callbackHandle,this);
    local_30.m_enableLog = true;
    glu::CallLogWrapper::glPushDebugGroup(&local_30,0x824a,0x4d2,-1,"Pushed debug stack");
    message = &this->m_lastMessage;
    BaseCase::verifyMessage(&this->super_BaseCase,message,0x824a,0x8269,0x4d2,severity);
    glu::CallLogWrapper::glPopDebugGroup(&local_30);
    BaseCase::verifyMessage(&this->super_BaseCase,message,0x824a,0x826a,0x4d2,severity);
    glu::CallLogWrapper::glPushDebugGroup(&local_30,0x8249,0x1087,-1,"Pushed debug stack");
    BaseCase::verifyMessage(&this->super_BaseCase,message,0x8249,0x8269,0x1087,severity);
    glu::CallLogWrapper::glPopDebugGroup(&local_30);
    BaseCase::verifyMessage(&this->super_BaseCase,message,0x8249,0x826a,0x1087,severity);
    (*gl->debugMessageCallback)((GLDEBUGPROC)0x0,(void *)0x0);
    (*gl->disable)(0x92e0);
    tcu::ResultCollector::setTestContextResult
              (&(this->super_BaseCase).m_results,
               (this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
               m_testCtx);
    glu::CallLogWrapper::~CallLogWrapper(&local_30);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x55b);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

GroupCase::IterateResult GroupCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	tcu::TestLog&			log		= m_testCtx.getLog();
	glu::CallLogWrapper		wrapper	(gl, log);

	gl.enable(GL_DEBUG_OUTPUT);
	gl.enable(GL_DEBUG_OUTPUT_SYNCHRONOUS);
	gl.debugMessageControl(GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, 0, DE_NULL, false); // disable all
	gl.debugMessageControl(GL_DEBUG_SOURCE_API, GL_DEBUG_TYPE_ERROR, GL_DONT_CARE, 0, DE_NULL, true); // enable API errors
	gl.debugMessageControl(GL_DEBUG_SOURCE_APPLICATION, GL_DONT_CARE, GL_DONT_CARE, 0, DE_NULL, true); // enable application messages
	gl.debugMessageControl(GL_DEBUG_SOURCE_THIRD_PARTY, GL_DONT_CARE, GL_DONT_CARE, 0, DE_NULL, true); // enable third party messages
	gl.debugMessageCallback(callbackHandle, this);

	wrapper.enableLogging(true);
	wrapper.glPushDebugGroup(GL_DEBUG_SOURCE_APPLICATION, 1234, -1, "Pushed debug stack");
	verifyMessage(m_lastMessage, GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_PUSH_GROUP, 1234, GL_DEBUG_SEVERITY_NOTIFICATION);
	wrapper.glPopDebugGroup();
	verifyMessage(m_lastMessage, GL_DEBUG_SOURCE_APPLICATION, GL_DEBUG_TYPE_POP_GROUP, 1234, GL_DEBUG_SEVERITY_NOTIFICATION);

	wrapper.glPushDebugGroup(GL_DEBUG_SOURCE_THIRD_PARTY, 4231, -1, "Pushed debug stack");
	verifyMessage(m_lastMessage, GL_DEBUG_SOURCE_THIRD_PARTY, GL_DEBUG_TYPE_PUSH_GROUP, 4231, GL_DEBUG_SEVERITY_NOTIFICATION);
	wrapper.glPopDebugGroup();
	verifyMessage(m_lastMessage, GL_DEBUG_SOURCE_THIRD_PARTY, GL_DEBUG_TYPE_POP_GROUP, 4231, GL_DEBUG_SEVERITY_NOTIFICATION);

	gl.debugMessageCallback(DE_NULL, DE_NULL);
	gl.disable(GL_DEBUG_OUTPUT);

	m_results.setTestContextResult(m_testCtx);

	return STOP;
}